

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O0

void __thiscall
Diligent::ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>::
CheckResources(ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>
               *this,IResourceMapping *pResourceMapping,BIND_SHADER_RESOURCES_FLAGS Flags,
              SHADER_RESOURCE_VARIABLE_TYPE_FLAGS *StaleVarTypes)

{
  ResourceCacheContentType RVar1;
  BIND_SHADER_RESOURCES_FLAGS BVar2;
  SHADER_RESOURCE_VARIABLE_TYPE_FLAGS b;
  SHADER_RESOURCE_VARIABLE_TYPE_FLAGS SVar3;
  bool bVar4;
  uint local_38;
  Uint32 v;
  SHADER_RESOURCE_VARIABLE_TYPE_FLAGS AllowedTypes;
  ThisImplType *pThis;
  SHADER_RESOURCE_VARIABLE_TYPE_FLAGS *StaleVarTypes_local;
  IResourceMapping *pIStack_18;
  BIND_SHADER_RESOURCES_FLAGS Flags_local;
  IResourceMapping *pResourceMapping_local;
  ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>
  *this_local;
  
  StaleVarTypes_local._4_4_ = Flags;
  pIStack_18 = pResourceMapping;
  pResourceMapping_local = (IResourceMapping *)this;
  BVar2 = Diligent::operator&(Flags,BIND_SHADER_RESOURCES_UPDATE_ALL);
  if (BVar2 == 0) {
    Diligent::operator|=
              ((BIND_SHADER_RESOURCES_FLAGS *)((long)&StaleVarTypes_local + 4),
               BIND_SHADER_RESOURCES_UPDATE_ALL);
  }
  RVar1 = ShaderResourceCacheVk::GetContentType(this->m_ResourceCache);
  b = SHADER_RESOURCE_VARIABLE_TYPE_FLAG_STATIC;
  if (RVar1 == SRB) {
    b = SHADER_RESOURCE_VARIABLE_TYPE_FLAG_MUT_DYN;
  }
  local_38 = 0;
  while( true ) {
    bVar4 = false;
    if (local_38 < *(uint *)&this[1].m_Owner) {
      SVar3 = Diligent::operator&(*StaleVarTypes,b);
      bVar4 = SVar3 != b;
    }
    if (!bVar4) break;
    ShaderVariableBase<Diligent::ShaderVariableVkImpl,_Diligent::ShaderVariableManagerVk,_Diligent::IShaderResourceVariable>
    ::CheckResources(&this->m_pVariables[local_38].
                      super_ShaderVariableBase<Diligent::ShaderVariableVkImpl,_Diligent::ShaderVariableManagerVk,_Diligent::IShaderResourceVariable>
                     ,pIStack_18,StaleVarTypes_local._4_4_,StaleVarTypes);
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

void CheckResources(IResourceMapping*                    pResourceMapping,
                        BIND_SHADER_RESOURCES_FLAGS          Flags,
                        SHADER_RESOURCE_VARIABLE_TYPE_FLAGS& StaleVarTypes) const
    {
        if ((Flags & BIND_SHADER_RESOURCES_UPDATE_ALL) == 0)
            Flags |= BIND_SHADER_RESOURCES_UPDATE_ALL;

        const ThisImplType*                       pThis        = static_cast<const ThisImplType*>(this);
        const SHADER_RESOURCE_VARIABLE_TYPE_FLAGS AllowedTypes = m_ResourceCache.GetContentType() == ResourceCacheContentType::SRB ?
            SHADER_RESOURCE_VARIABLE_TYPE_FLAG_MUT_DYN :
            SHADER_RESOURCE_VARIABLE_TYPE_FLAG_STATIC;
        for (Uint32 v = 0; (v < pThis->m_NumVariables) && (StaleVarTypes & AllowedTypes) != AllowedTypes; ++v)
        {
            m_pVariables[v].CheckResources(pResourceMapping, Flags, StaleVarTypes);
        }
    }